

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::setTex3DBinding(ReferenceContext *this,int unitNdx,Texture3D *texture)

{
  int *piVar1;
  Texture3D *object;
  
  object = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding;
  if (object != (Texture3D *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,&object->super_Texture)
    ;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding = (Texture3D *)0x0;
  }
  if (texture != (Texture3D *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex3DBinding (int unitNdx, Texture3D* texture)
{
	if (m_textureUnits[unitNdx].tex3DBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex3DBinding);
		m_textureUnits[unitNdx].tex3DBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex3DBinding = texture;
	}
}